

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall tonk::Connection::initSubsystems(Connection *this)

{
  bool bVar1;
  Connection *in_RSI;
  ErrorResult *in_RDI;
  undefined1 uVar2;
  Parameters sparams;
  Result result;
  bool enablePadding;
  bool enableCompression;
  undefined7 in_stack_fffffffffffffeb8;
  Parameters *in_stack_fffffffffffffec0;
  Dependencies *deps;
  SenderBandwidthControl *this_00;
  ErrorResult *args;
  Dependencies *deps_00;
  ReceiverBandwidthControl *pRVar3;
  Parameters local_d8;
  uint64_t in_stack_ffffffffffffff30;
  Dependencies *in_stack_ffffffffffffff38;
  SessionOutgoing *in_stack_ffffffffffffff40;
  TonkConnection connection;
  TonkConnectionConfig *config;
  Dependencies *deps_01;
  SessionIncoming *in_stack_ffffffffffffff60;
  SessionIncoming *local_60;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 *local_40;
  SessionIncoming **local_38;
  SessionIncoming **local_30;
  SessionIncoming **local_28;
  SessionIncoming **local_20;
  SessionIncoming **local_10;
  
  args = in_RDI;
  memset(&in_RSI->CachedLocalAddress,0,0x2a);
  memset(in_RSI->LastIdAndAddressSent,0,0x16);
  local_51 = (in_RSI->SocketConfig->Flags & 4) == 0;
  local_52 = (in_RSI->SocketConfig->Flags & 8) != 0;
  SessionOutgoing::Initialize
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_28 = &local_60;
  if (local_60 == (SessionIncoming *)0x0) {
    in_stack_fffffffffffffec0 = (Parameters *)&in_RSI->Incoming;
    connection = (TonkConnection)&in_RSI->TimeSync;
    config = (TonkConnectionConfig *)&in_RSI->Outgoing;
    pRVar3 = &in_RSI->ReceiverControl;
    deps_01 = (Dependencies *)&in_RSI->Logger;
    deps = (Dependencies *)in_RSI->EncryptionKey;
    this_00 = (SenderBandwidthControl *)&in_RSI->ConnectionConfig;
    GetTonkConnection(in_RSI);
    SessionIncoming::Initialize
              (in_stack_ffffffffffffff60,deps_01,(uint64_t)pRVar3,config,connection);
    local_38 = &local_60;
    local_40 = &stack0xffffffffffffff60;
    local_60 = in_stack_ffffffffffffff60;
    Result::~Result((Result *)in_stack_fffffffffffffec0);
    local_30 = &local_60;
    uVar2 = local_60 != (SessionIncoming *)0x0;
    if ((bool)uVar2) {
      local_10 = &local_60;
      in_RDI->Source = (char *)local_60;
      local_60 = (SessionIncoming *)0x0;
    }
    else {
      SenderBandwidthControl::Parameters::Parameters(&local_d8);
      local_d8.MaximumBPS = in_RSI->SocketConfig->BandwidthLimitBPS;
      if (20000000 < local_d8.MaximumBPS) {
        local_d8.MaximumBPS = 20000000;
      }
      deps_00 = (Dependencies *)&in_RSI->TimeSync;
      pRVar3 = (ReceiverBandwidthControl *)&in_RSI->Logger;
      SenderBandwidthControl::Initialize(this_00,deps,in_stack_fffffffffffffec0);
      ReceiverBandwidthControl::Initialize(pRVar3,deps_00);
      std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffec0);
      MakeUniqueNoThrow<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,asio::io_context&>
                ((io_context *)args);
      std::
      unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ::operator=((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                   *)in_stack_fffffffffffffec0,
                  (unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                   *)CONCAT17(uVar2,in_stack_fffffffffffffeb8));
      std::
      unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                     *)in_stack_fffffffffffffec0);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                          *)0x19eebc);
      if (bVar1) {
        Result::Success();
      }
      else {
        Result::OutOfMemory();
      }
    }
  }
  else {
    local_20 = &local_60;
    in_RDI->Source = (char *)local_60;
    local_60 = (SessionIncoming *)0x0;
  }
  Result::~Result((Result *)in_stack_fffffffffffffec0);
  return (Result)args;
}

Assistant:

Result Connection::initSubsystems()
{
#ifdef TONK_DETAILED_STATS
    // Cycle the detail statistics
    Deets.NextWrite();
    Deets.GetWritePtr()->TimestampUsec = siamese::GetTimeUsec();
#endif // TONK_DETAILED_STATS

    memset(&CachedLocalAddress, 0, sizeof(CachedLocalAddress));
    memset(&LastIdAndAddressSent, 0, sizeof(LastIdAndAddressSent));

    const bool enableCompression = \
        (SocketConfig->Flags & TONK_FLAGS_DISABLE_COMPRESSION) == 0;

    const bool enablePadding = \
        (SocketConfig->Flags & TONK_FLAGS_ENABLE_PADDING) != 0;

    Result result = Outgoing.Initialize({
        enableCompression,
        enablePadding,
        &Logger,
        Deps.UDPSender,
        &SelfRefCount,
#ifdef TONK_DETAILED_STATS
        &Deets,
#endif // TONK_DETAILED_STATS
        &SenderControl
    },
        EncryptionKey);
    if (result.IsFail()) {
        return result;
    }

    // Initialize Incoming object given the app context
    result = Incoming.Initialize({
        &SelfRefCount,
        this,
        &TimeSync,
        &Outgoing,
        &ReceiverControl,
#ifdef TONK_DETAILED_STATS
        &Deets,
#endif // TONK_DETAILED_STATS
        &Logger
    },
        EncryptionKey,
        &ConnectionConfig,
        GetTonkConnection());
    if (result.IsFail()) {
        return result;
    }

    // Configure the bandwidth limit
    SenderBandwidthControl::Parameters sparams;
    sparams.MaximumBPS = (unsigned)SocketConfig->BandwidthLimitBPS;
    if (sparams.MaximumBPS > TONK_MAX_BPS) {
        sparams.MaximumBPS = TONK_MAX_BPS;
    }

    // Initialize bandwidth control
    SenderControl.Initialize({
        &TimeSync,
        &Logger
    },
        sparams);
    ReceiverControl.Initialize({
        &TimeSync,
        &Logger
    });

    // Create the timer
    Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Deps.Context);
    if (!Ticker) {
        return Result::OutOfMemory();
    }

    return Result::Success();
}